

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

int __thiscall kj::_::PromiseNode::OnReadyEvent::init(OnReadyEvent *this,EVP_PKEY_CTX *ctx)

{
  OnReadyEvent *extraout_RAX;
  Event *newEvent_local;
  OnReadyEvent *this_local;
  
  if (this->event == (Event *)0x1) {
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      Event::armBreadthFirst((Event *)ctx);
      this = extraout_RAX;
    }
  }
  else {
    this->event = (Event *)ctx;
  }
  return (int)this;
}

Assistant:

void PromiseNode::OnReadyEvent::init(Event* newEvent) {
  if (event == _kJ_ALREADY_READY) {
    // A new continuation was added to a promise that was already ready.  In this case, we schedule
    // breadth-first, to make it difficult for applications to accidentally starve the event loop
    // by repeatedly waiting on immediate promises.
    if (newEvent) newEvent->armBreadthFirst();
  } else {
    event = newEvent;
  }
}